

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

void __thiscall QThreadPrivate::~QThreadPrivate(QThreadPrivate *this)

{
  ulong uVar1;
  void *pvVar2;
  Data *pDVar3;
  undefined8 *puVar4;
  
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QThreadPrivate_0069c4f0;
  uVar1 = (this->m_statusOrPendingObjects).data.super___atomic_base<unsigned_long_long>._M_i;
  puVar4 = (undefined8 *)(-(ulong)((uint)uVar1 & 1) & uVar1 & 0xfffffffffffffffe);
  if ((puVar4 != (undefined8 *)0x0) && (pvVar2 = (void *)*puVar4, pvVar2 != (void *)0x0)) {
    operator_delete(pvVar2,puVar4[2] - (long)pvVar2);
  }
  operator_delete(puVar4,0x18);
  QThreadData::clearEvents(this->data);
  QThreadData::deref(this->data);
  pDVar3 = (this->objectName).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->objectName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QWaitCondition::~QWaitCondition(&this->thread_done);
  QMutex::~QMutex(&this->mutex);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QThreadPrivate::~QThreadPrivate()
{
    // access to m_statusOrPendingObjects cannot race with anything
    // unless there is already a potential use-after-free bug, as the
    // thread is in the process of being destroyed
    delete m_statusOrPendingObjects.list();
    data->clearEvents();
    data->deref();
}